

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::ClearDestinations(RTPUDPv4Transmitter *this)

{
  RTPUDPv4Transmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
    ::Clear(&this->destinations);
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::ClearDestinations()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
		destinations.Clear();
	MAINMUTEX_UNLOCK
}